

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPUDPv6Transmitter::RTPUDPv6Transmitter(RTPUDPv6Transmitter *this,RTPMemoryManager *mgr)

{
  RTPMemoryManager *pRVar1;
  RTPMemoryManager *mgr_local;
  RTPUDPv6Transmitter *this_local;
  
  RTPTransmitter::RTPTransmitter(&this->super_RTPTransmitter,mgr);
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPUDPv6Transmitter_00193220;
  std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::list(&this->localIPs);
  pRVar1 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
  RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
  ::RTPHashTable(&this->destinations,pRVar1,0xd);
  pRVar1 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
  RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::RTPHashTable
            (&this->multicastgroups,pRVar1,0xe);
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::list
            (&this->rawpacketlist);
  pRVar1 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
  RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
  ::RTPKeyHashTable(&this->acceptignoreinfo,pRVar1,0xb);
  RTPAbortDescriptors::RTPAbortDescriptors(&this->m_abortDesc);
  this->created = false;
  this->init = false;
  return;
}

Assistant:

RTPUDPv6Transmitter::RTPUDPv6Transmitter(RTPMemoryManager *mgr) : RTPTransmitter(mgr),
								  destinations(GetMemoryManager(),RTPMEM_TYPE_CLASS_DESTINATIONLISTHASHELEMENT),
								  multicastgroups(GetMemoryManager(),RTPMEM_TYPE_CLASS_MULTICASTHASHELEMENT),
								  acceptignoreinfo(GetMemoryManager(),RTPMEM_TYPE_CLASS_ACCEPTIGNOREHASHELEMENT)
{
	created = false;
	init = false;
}